

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_common_avl.c
# Opt level: O0

void test_insert_nondup(_Bool do_random)

{
  int iVar1;
  _Bool do_random_local;
  
  cunit_start_test("test_insert_nondup");
  avl_init(&head,avl_comp_uint32,0);
  add_elements(nodes,do_random);
  cunit_named_check(head.count == 6,"test_insert_nondup",0xef,"tree not completely filled");
  check_tree("test_insert_nondup",0xf0);
  additional_node1.value = nodes[3].value;
  additional_node1.node.key = &additional_node1;
  iVar1 = avl_insert(&head,0x10a278);
  cunit_named_check(iVar1 != 0,"test_insert_nondup",0xf6,
                    "insert duplicate (in non-dup tree) was successful");
  cunit_named_check(head.count == 6,"test_insert_nondup",0xf8,
                    "tree not completely filled after insert");
  check_tree("test_insert_nondup",0xf9);
  cunit_end_test("test_insert_nondup");
  return;
}

Assistant:

static void test_insert_nondup(bool do_random) {
  START_TEST();
  avl_init(&head, avl_comp_uint32, false);
  add_elements(nodes, do_random);

  CHECK_TRUE(head.count == COUNT, "tree not completely filled");
  check_tree(__func__, __LINE__);
  // print_tree();

  /* try to add duplicate */
  additional_node1.value = nodes[3].value;
  additional_node1.node.key = &additional_node1.value;
  CHECK_TRUE(avl_insert(&head, &additional_node1.node) != 0, "insert duplicate (in non-dup tree) was successful");

  CHECK_TRUE(head.count == COUNT, "tree not completely filled after insert");
  check_tree(__func__, __LINE__);

  END_TEST();
}